

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_fastcgi_module.c
# Opt level: O1

ngx_int_t ngx_http_fastcgi_process_header(ngx_http_request_t *r)

{
  size_t *psVar1;
  ngx_buf_t *b;
  ngx_http_fastcgi_ctx_t *f;
  ngx_hash_t *hash;
  ngx_http_upstream_t *pnVar2;
  byte *s1;
  ngx_http_cache_t *pnVar3;
  u_char *puVar4;
  size_t sVar5;
  ngx_table_elt_t *pnVar6;
  ngx_http_upstream_state_t *pnVar7;
  bool bVar8;
  bool bVar9;
  ngx_int_t nVar10;
  byte *pbVar11;
  byte *pbVar12;
  u_char *puVar13;
  ngx_uint_t *pnVar14;
  ngx_uint_t nVar15;
  u_char *puVar16;
  void *pvVar17;
  long lVar18;
  ngx_array_t *pnVar19;
  u_char *puVar20;
  long *plVar21;
  ngx_uint_t nVar22;
  char *pcVar23;
  u_char *puVar24;
  size_t size;
  ngx_log_t *pnVar25;
  ngx_str_t *pnVar26;
  undefined8 *puVar27;
  long *plVar28;
  ulong uVar29;
  undefined1 local_e0 [8];
  ngx_buf_t buf;
  u_char *local_48;
  byte *local_40;
  ngx_int_t local_38;
  
  f = (ngx_http_fastcgi_ctx_t *)r->ctx[ngx_http_fastcgi_module.ctx_index];
  hash = (ngx_hash_t *)r->main_conf[ngx_http_upstream_module.ctx_index];
  pnVar2 = r->upstream;
  b = &pnVar2->buffer;
  buf._72_8_ = &pnVar2->headers_in;
LAB_001743aa:
  do {
    if (f->state < ngx_http_fastcgi_st_data) {
      f->pos = (pnVar2->buffer).pos;
      f->last = (pnVar2->buffer).last;
      nVar10 = ngx_http_fastcgi_process_record(r,f);
      (pnVar2->buffer).pos = f->pos;
      (pnVar2->buffer).last = f->last;
      if (nVar10 == -2) {
        return -2;
      }
      if (nVar10 == -1) {
        return 0x28;
      }
      pnVar26 = (ngx_str_t *)f->type;
      if (((ulong)pnVar26 & 0xfffffffffffffffe) != 6) {
        pnVar25 = r->connection->log;
        if (pnVar25->log_level < 4) {
          return 0x28;
        }
        pcVar23 = "upstream sent unexpected FastCGI record: %ui";
LAB_00174b7c:
        ngx_log_error_core(4,pnVar25,0,pcVar23,pnVar26);
        return 0x28;
      }
      if ((pnVar26 == (ngx_str_t *)0x6) && (f->length == 0)) {
        pnVar25 = r->connection->log;
        if (pnVar25->log_level < 4) {
          return 0x28;
        }
        pcVar23 = "upstream prematurely closed FastCGI stdout";
LAB_00174b48:
        local_38 = 0x28;
        nVar15 = 4;
LAB_00174b9f:
        ngx_log_error_core(nVar15,pnVar25,0,pcVar23);
        return local_38;
      }
    }
    if (f->state == ngx_http_fastcgi_st_padding) {
      puVar13 = (pnVar2->buffer).last;
      puVar20 = (pnVar2->buffer).pos + f->padding;
      if (puVar13 <= puVar20) {
        if ((long)puVar20 - (long)puVar13 == 0) {
          f->state = ngx_http_fastcgi_st_version;
        }
        else {
          f->padding = (long)puVar20 - (long)puVar13;
        }
        (pnVar2->buffer).pos = puVar13;
        return -2;
      }
      f->state = ngx_http_fastcgi_st_version;
      (pnVar2->buffer).pos = puVar20;
      goto LAB_001743aa;
    }
    if (f->type == 7) {
      if (f->length == 0) {
        f->state = ngx_http_fastcgi_st_padding;
      }
      else {
        s1 = (pnVar2->buffer).pos;
        pbVar12 = (pnVar2->buffer).last;
        pbVar11 = s1 + f->length;
        if (pbVar11 < pbVar12 || (long)pbVar11 - (long)pbVar12 == 0) {
          (pnVar2->buffer).pos = pbVar11;
          f->length = 0;
          f->state = ngx_http_fastcgi_st_padding;
        }
        else {
          f->length = (long)pbVar11 - (long)pbVar12;
          (pnVar2->buffer).pos = pbVar12;
        }
        local_40 = (pnVar2->buffer).pos;
        pbVar12 = local_40 + -1;
        if (s1 < pbVar12) {
          do {
            if ((0x2e < (ulong)*pbVar12) || ((0x400100002400U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0)
               ) break;
            pbVar12 = pbVar12 + -1;
          } while (s1 < pbVar12);
          local_40 = pbVar12 + 1;
        }
        pnVar25 = r->connection->log;
        if (3 < pnVar25->log_level) {
          ngx_log_error_core(4,pnVar25,0,"FastCGI sent in stderr: \"%*s\"",(long)local_40 - (long)s1
                             ,s1);
        }
        pvVar17 = r->loc_conf[ngx_http_fastcgi_module.ctx_index];
        if ((*(long **)((long)pvVar17 + 0x230) != (long *)0x0) &&
           (*(long *)(*(long *)((long)pvVar17 + 0x230) + 8) != 0)) {
          puVar27 = (undefined8 *)(**(long **)((long)pvVar17 + 0x230) + 8);
          uVar29 = 0;
          do {
            puVar13 = ngx_strnstr(s1,(char *)*puVar27,(long)local_40 - (long)s1);
            if (puVar13 != (u_char *)0x0) {
              return 0x28;
            }
            uVar29 = uVar29 + 1;
            puVar27 = puVar27 + 2;
          } while (uVar29 < *(ulong *)(*(long *)((long)pvVar17 + 0x230) + 8));
        }
        if ((pnVar2->buffer).pos == (pnVar2->buffer).last) {
          if ((f->field_0x40 & 1) != 0) {
            return -2;
          }
          puVar13 = (pnVar2->buffer).start;
          if (r->cache != (ngx_http_cache_t *)0x0) {
            puVar13 = puVar13 + r->cache->header_start;
          }
          (pnVar2->buffer).pos = puVar13;
          (pnVar2->buffer).last = puVar13;
          f->field_0x40 = f->field_0x40 | 2;
          return -2;
        }
      }
    }
    else {
      if (((f->field_0x40 & 2) != 0) && (pnVar3 = r->cache, pnVar3 != (ngx_http_cache_t *)0x0)) {
        puVar20 = (pnVar2->buffer).start + pnVar3->header_start;
        puVar13 = (pnVar2->buffer).pos;
        puVar24 = puVar13 + (-0x10 - (long)puVar20);
        if ((long)puVar24 < 0) {
          pnVar3->header_start = (size_t)(puVar13 + (pnVar3->header_start - (long)puVar20) + -8);
        }
        else {
          puVar20[0] = '\x01';
          puVar20[1] = '\a';
          puVar20[2] = '\0';
          puVar20[3] = '\x01';
          puVar20[4] = (u_char)((ulong)puVar24 >> 8);
          puVar20[5] = (u_char)puVar24;
          puVar20[6] = '\0';
          puVar20[7] = '\0';
        }
        f->field_0x40 = f->field_0x40 & 0xfd;
      }
      f->field_0x40 = f->field_0x40 | 1;
      puVar13 = (pnVar2->buffer).pos;
      local_48 = (pnVar2->buffer).last;
      puVar20 = puVar13 + f->length;
      if (puVar20 < local_48) {
        (pnVar2->buffer).last = puVar20;
      }
      else {
        local_48 = (u_char *)0x0;
      }
      do {
        puVar20 = (pnVar2->buffer).pos;
        puVar24 = (pnVar2->buffer).last;
        nVar10 = ngx_http_parse_header_line(r,b,1);
        pnVar25 = r->connection->log;
        if ((pnVar25->log_level & 0x100) != 0) {
          ngx_log_error_core(8,pnVar25,0,"http fastcgi parser: %i",nVar10);
        }
        if (nVar10 != 0) {
          if (nVar10 == -2) {
            bVar9 = false;
            goto LAB_001749ea;
          }
          if (nVar10 != 1) {
            pnVar25 = r->connection->log;
            if (pnVar25->log_level < 4) {
              return 0x28;
            }
            pcVar23 = "upstream sent invalid header";
            goto LAB_00174b48;
          }
          pnVar25 = r->connection->log;
          if ((pnVar25->log_level & 0x100) != 0) {
            ngx_log_error_core(8,pnVar25,0,"http fastcgi header done");
          }
          pnVar6 = (pnVar2->headers_in).status;
          if (pnVar6 == (ngx_table_elt_t *)0x0) {
            if ((pnVar2->headers_in).location == (ngx_table_elt_t *)0x0) {
              (pnVar2->headers_in).status_n = 200;
              (pnVar2->headers_in).status_line.len = 6;
              pcVar23 = "200 OK";
            }
            else {
              (pnVar2->headers_in).status_n = 0x12e;
              (pnVar2->headers_in).status_line.len = 0x15;
              pcVar23 = "302 Moved Temporarily";
            }
            (pnVar2->headers_in).status_line.data = (u_char *)pcVar23;
          }
          else {
            pnVar26 = &pnVar6->value;
            nVar15 = ngx_atoi((pnVar6->value).data,3);
            if (nVar15 == 0xffffffffffffffff) {
              pnVar25 = r->connection->log;
              if (pnVar25->log_level < 4) {
                return 0x28;
              }
              pcVar23 = "upstream sent invalid status \"%V\"";
              goto LAB_00174b7c;
            }
            (pnVar2->headers_in).status_n = nVar15;
            puVar16 = (pnVar6->value).data;
            (pnVar2->headers_in).status_line.len = pnVar26->len;
            (pnVar2->headers_in).status_line.data = puVar16;
          }
          pnVar7 = pnVar2->state;
          bVar8 = true;
          if ((pnVar7 != (ngx_http_upstream_state_t *)0x0) && (pnVar7->status == 0)) {
            pnVar7->status = (pnVar2->headers_in).status_n;
          }
          bVar9 = false;
          goto LAB_00174a69;
        }
        pnVar14 = (ngx_uint_t *)ngx_list_push((ngx_list_t *)buf._72_8_);
        local_38 = -1;
        if (pnVar14 == (ngx_uint_t *)0x0) {
          return -1;
        }
        pnVar19 = f->split_parts;
        if ((pnVar19 == (ngx_array_t *)0x0) || (nVar15 = pnVar19->nelts, nVar15 == 0)) {
          nVar15 = (long)r->header_name_end - (long)r->header_name_start;
          pnVar14[1] = nVar15;
          nVar22 = (long)r->header_end - (long)r->header_start;
          pnVar14[3] = nVar22;
          pvVar17 = ngx_pnalloc(r->pool,nVar22 + nVar15 * 2 + 2);
          pnVar14[2] = (ngx_uint_t)pvVar17;
          if (pvVar17 == (void *)0x0) {
            return -1;
          }
          sVar5 = pnVar14[1];
          pnVar14[4] = (long)pvVar17 + sVar5 + 1;
          pnVar14[5] = (long)pvVar17 + pnVar14[3] + sVar5 + 2;
          memcpy(pvVar17,r->header_name_start,sVar5);
          *(undefined1 *)(pnVar14[2] + pnVar14[1]) = 0;
          memcpy((void *)pnVar14[4],r->header_start,pnVar14[3]);
          *(undefined1 *)(pnVar14[4] + pnVar14[3]) = 0;
        }
        else {
          size = (long)b->pos - (long)puVar20;
          plVar28 = (long *)((long)pnVar19->elts + 8);
          plVar21 = plVar28;
          do {
            size = (size + *plVar21) - plVar21[-1];
            plVar21 = plVar21 + 2;
            nVar15 = nVar15 - 1;
          } while (nVar15 != 0);
          puVar16 = (u_char *)ngx_pnalloc(r->pool,size);
          if (puVar16 == (u_char *)0x0) {
            return -1;
          }
          local_e0 = (undefined1  [8])puVar16;
          if (f->split_parts->nelts != 0) {
            uVar29 = 0;
            do {
              memcpy(puVar16,(void *)plVar28[-1],*plVar28 - plVar28[-1]);
              puVar16 = puVar16 + (*plVar28 - plVar28[-1]);
              uVar29 = uVar29 + 1;
              plVar28 = plVar28 + 2;
            } while (uVar29 < f->split_parts->nelts);
          }
          memcpy(puVar16,puVar20,(long)b->pos - (long)puVar20);
          buf.pos = puVar16 + ((long)b->pos - (long)puVar20);
          f->split_parts->nelts = 0;
          nVar10 = ngx_http_parse_header_line(r,(ngx_buf_t *)local_e0,1);
          if (nVar10 != 0) {
            pnVar25 = r->connection->log;
            if (pnVar25->log_level < 2) {
              return -1;
            }
            pcVar23 = "invalid header after joining FastCGI records";
            nVar15 = 2;
            goto LAB_00174b9f;
          }
          puVar16 = r->header_name_start;
          puVar4 = r->header_name_end;
          pnVar14[1] = (long)puVar4 - (long)puVar16;
          pnVar14[2] = (ngx_uint_t)puVar16;
          *puVar4 = '\0';
          puVar16 = r->header_start;
          puVar4 = r->header_end;
          pnVar14[3] = (long)puVar4 - (long)puVar16;
          pnVar14[4] = (ngx_uint_t)puVar16;
          *puVar4 = '\0';
          pvVar17 = ngx_pnalloc(r->pool,pnVar14[1]);
          pnVar14[5] = (ngx_uint_t)pvVar17;
          if (pvVar17 == (void *)0x0) {
            return -1;
          }
        }
        *pnVar14 = r->header_hash;
        sVar5 = pnVar14[1];
        if (sVar5 == r->lowcase_index) {
          memcpy((u_char *)pnVar14[5],r->lowcase_header,sVar5);
        }
        else {
          ngx_strlow((u_char *)pnVar14[5],(u_char *)pnVar14[2],sVar5);
        }
        pvVar17 = ngx_hash_find(hash,*pnVar14,(u_char *)pnVar14[5],pnVar14[1]);
        if ((pvVar17 != (void *)0x0) &&
           (lVar18 = (**(code **)((long)pvVar17 + 0x10))
                               (r,pnVar14,*(undefined8 *)((long)pvVar17 + 0x18)), lVar18 != 0)) {
          return -1;
        }
        pnVar25 = r->connection->log;
        if ((pnVar25->log_level & 0x100) != 0) {
          ngx_log_error_core(8,pnVar25,0,"http fastcgi header: \"%V: %V\"",pnVar14 + 1,pnVar14 + 3);
        }
      } while ((pnVar2->buffer).pos < (pnVar2->buffer).last);
      bVar9 = true;
LAB_001749ea:
      bVar8 = false;
LAB_00174a69:
      if (local_48 != (u_char *)0x0) {
        (pnVar2->buffer).last = local_48;
      }
      psVar1 = &f->length;
      *psVar1 = (size_t)(puVar13 + (*psVar1 - (long)b->pos));
      if (*psVar1 == 0) {
        f->state = ngx_http_fastcgi_st_padding;
      }
      if (bVar8) {
        return 0;
      }
      if (!bVar9) {
        pnVar25 = r->connection->log;
        if ((pnVar25->log_level & 0x100) != 0) {
          ngx_log_error_core(8,pnVar25,0,"upstream split a header line in FastCGI records");
        }
        if (f->split_parts == (ngx_array_t *)0x0) {
          pnVar19 = ngx_array_create(r->pool,1,0x10);
          f->split_parts = pnVar19;
          if (pnVar19 == (ngx_array_t *)0x0) {
            return -1;
          }
        }
        puVar27 = (undefined8 *)ngx_array_push(f->split_parts);
        if (puVar27 == (undefined8 *)0x0) {
          return -1;
        }
        *puVar27 = puVar20;
        puVar27[1] = puVar24;
        if ((pnVar2->buffer).last <= (pnVar2->buffer).pos) {
          return -2;
        }
      }
    }
  } while( true );
}

Assistant:

static ngx_int_t
ngx_http_fastcgi_process_header(ngx_http_request_t *r)
{
    u_char                         *p, *msg, *start, *last,
                                   *part_start, *part_end;
    size_t                          size;
    ngx_str_t                      *status_line, *pattern;
    ngx_int_t                       rc, status;
    ngx_buf_t                       buf;
    ngx_uint_t                      i;
    ngx_table_elt_t                *h;
    ngx_http_upstream_t            *u;
    ngx_http_fastcgi_ctx_t         *f;
    ngx_http_upstream_header_t     *hh;
    ngx_http_fastcgi_loc_conf_t    *flcf;
    ngx_http_fastcgi_split_part_t  *part;
    ngx_http_upstream_main_conf_t  *umcf;

    f = ngx_http_get_module_ctx(r, ngx_http_fastcgi_module);

    umcf = ngx_http_get_module_main_conf(r, ngx_http_upstream_module);

    u = r->upstream;

    for ( ;; ) {

        if (f->state < ngx_http_fastcgi_st_data) {

            f->pos = u->buffer.pos;
            f->last = u->buffer.last;

            rc = ngx_http_fastcgi_process_record(r, f);

            u->buffer.pos = f->pos;
            u->buffer.last = f->last;

            if (rc == NGX_AGAIN) {
                return NGX_AGAIN;
            }

            if (rc == NGX_ERROR) {
                return NGX_HTTP_UPSTREAM_INVALID_HEADER;
            }

            if (f->type != NGX_HTTP_FASTCGI_STDOUT
                && f->type != NGX_HTTP_FASTCGI_STDERR)
            {
                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "upstream sent unexpected FastCGI record: %ui",
                              f->type);

                return NGX_HTTP_UPSTREAM_INVALID_HEADER;
            }

            if (f->type == NGX_HTTP_FASTCGI_STDOUT && f->length == 0) {
                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "upstream prematurely closed FastCGI stdout");

                return NGX_HTTP_UPSTREAM_INVALID_HEADER;
            }
        }

        if (f->state == ngx_http_fastcgi_st_padding) {

            if (u->buffer.pos + f->padding < u->buffer.last) {
                f->state = ngx_http_fastcgi_st_version;
                u->buffer.pos += f->padding;

                continue;
            }

            if (u->buffer.pos + f->padding == u->buffer.last) {
                f->state = ngx_http_fastcgi_st_version;
                u->buffer.pos = u->buffer.last;

                return NGX_AGAIN;
            }

            f->padding -= u->buffer.last - u->buffer.pos;
            u->buffer.pos = u->buffer.last;

            return NGX_AGAIN;
        }


        /* f->state == ngx_http_fastcgi_st_data */

        if (f->type == NGX_HTTP_FASTCGI_STDERR) {

            if (f->length) {
                msg = u->buffer.pos;

                if (u->buffer.pos + f->length <= u->buffer.last) {
                    u->buffer.pos += f->length;
                    f->length = 0;
                    f->state = ngx_http_fastcgi_st_padding;

                } else {
                    f->length -= u->buffer.last - u->buffer.pos;
                    u->buffer.pos = u->buffer.last;
                }

                for (p = u->buffer.pos - 1; msg < p; p--) {
                    if (*p != LF && *p != CR && *p != '.' && *p != ' ') {
                        break;
                    }
                }

                p++;

                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "FastCGI sent in stderr: \"%*s\"", p - msg, msg);

                flcf = ngx_http_get_module_loc_conf(r, ngx_http_fastcgi_module);

                if (flcf->catch_stderr) {
                    pattern = flcf->catch_stderr->elts;

                    for (i = 0; i < flcf->catch_stderr->nelts; i++) {
                        if (ngx_strnstr(msg, (char *) pattern[i].data,
                                        p - msg)
                            != NULL)
                        {
                            return NGX_HTTP_UPSTREAM_INVALID_HEADER;
                        }
                    }
                }

                if (u->buffer.pos == u->buffer.last) {

                    if (!f->fastcgi_stdout) {

                        /*
                         * the special handling the large number
                         * of the PHP warnings to not allocate memory
                         */

#if (NGX_HTTP_CACHE)
                        if (r->cache) {
                            u->buffer.pos = u->buffer.start
                                                     + r->cache->header_start;
                        } else {
                            u->buffer.pos = u->buffer.start;
                        }
#else
                        u->buffer.pos = u->buffer.start;
#endif
                        u->buffer.last = u->buffer.pos;
                        f->large_stderr = 1;
                    }

                    return NGX_AGAIN;
                }

            } else {
                f->state = ngx_http_fastcgi_st_padding;
            }

            continue;
        }


        /* f->type == NGX_HTTP_FASTCGI_STDOUT */

#if (NGX_HTTP_CACHE)

        if (f->large_stderr && r->cache) {
            ssize_t                     len;
            ngx_http_fastcgi_header_t  *fh;

            start = u->buffer.start + r->cache->header_start;

            len = u->buffer.pos - start - 2 * sizeof(ngx_http_fastcgi_header_t);

            /*
             * A tail of large stderr output before HTTP header is placed
             * in a cache file without a FastCGI record header.
             * To workaround it we put a dummy FastCGI record header at the
             * start of the stderr output or update r->cache_header_start,
             * if there is no enough place for the record header.
             */

            if (len >= 0) {
                fh = (ngx_http_fastcgi_header_t *) start;
                fh->version = 1;
                fh->type = NGX_HTTP_FASTCGI_STDERR;
                fh->request_id_hi = 0;
                fh->request_id_lo = 1;
                fh->content_length_hi = (u_char) ((len >> 8) & 0xff);
                fh->content_length_lo = (u_char) (len & 0xff);
                fh->padding_length = 0;
                fh->reserved = 0;

            } else {
                r->cache->header_start += u->buffer.pos - start
                                          - sizeof(ngx_http_fastcgi_header_t);
            }

            f->large_stderr = 0;
        }

#endif

        f->fastcgi_stdout = 1;

        start = u->buffer.pos;

        if (u->buffer.pos + f->length < u->buffer.last) {

            /*
             * set u->buffer.last to the end of the FastCGI record data
             * for ngx_http_parse_header_line()
             */

            last = u->buffer.last;
            u->buffer.last = u->buffer.pos + f->length;

        } else {
            last = NULL;
        }

        for ( ;; ) {

            part_start = u->buffer.pos;
            part_end = u->buffer.last;

            rc = ngx_http_parse_header_line(r, &u->buffer, 1);

            ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                           "http fastcgi parser: %i", rc);

            if (rc == NGX_AGAIN) {
                break;
            }

            if (rc == NGX_OK) {

                /* a header line has been parsed successfully */

                h = ngx_list_push(&u->headers_in.headers);
                if (h == NULL) {
                    return NGX_ERROR;
                }

                if (f->split_parts && f->split_parts->nelts) {

                    part = f->split_parts->elts;
                    size = u->buffer.pos - part_start;

                    for (i = 0; i < f->split_parts->nelts; i++) {
                        size += part[i].end - part[i].start;
                    }

                    p = ngx_pnalloc(r->pool, size);
                    if (p == NULL) {
                        return NGX_ERROR;
                    }

                    buf.pos = p;

                    for (i = 0; i < f->split_parts->nelts; i++) {
                        p = ngx_cpymem(p, part[i].start,
                                       part[i].end - part[i].start);
                    }

                    p = ngx_cpymem(p, part_start, u->buffer.pos - part_start);

                    buf.last = p;

                    f->split_parts->nelts = 0;

                    rc = ngx_http_parse_header_line(r, &buf, 1);

                    if (rc != NGX_OK) {
                        ngx_log_error(NGX_LOG_ALERT, r->connection->log, 0,
                                      "invalid header after joining "
                                      "FastCGI records");
                        return NGX_ERROR;
                    }

                    h->key.len = r->header_name_end - r->header_name_start;
                    h->key.data = r->header_name_start;
                    h->key.data[h->key.len] = '\0';

                    h->value.len = r->header_end - r->header_start;
                    h->value.data = r->header_start;
                    h->value.data[h->value.len] = '\0';

                    h->lowcase_key = ngx_pnalloc(r->pool, h->key.len);
                    if (h->lowcase_key == NULL) {
                        return NGX_ERROR;
                    }

                } else {

                    h->key.len = r->header_name_end - r->header_name_start;
                    h->value.len = r->header_end - r->header_start;

                    h->key.data = ngx_pnalloc(r->pool,
                                              h->key.len + 1 + h->value.len + 1
                                              + h->key.len);
                    if (h->key.data == NULL) {
                        return NGX_ERROR;
                    }

                    h->value.data = h->key.data + h->key.len + 1;
                    h->lowcase_key = h->key.data + h->key.len + 1
                                     + h->value.len + 1;

                    ngx_memcpy(h->key.data, r->header_name_start, h->key.len);
                    h->key.data[h->key.len] = '\0';
                    ngx_memcpy(h->value.data, r->header_start, h->value.len);
                    h->value.data[h->value.len] = '\0';
                }

                h->hash = r->header_hash;

                if (h->key.len == r->lowcase_index) {
                    ngx_memcpy(h->lowcase_key, r->lowcase_header, h->key.len);

                } else {
                    ngx_strlow(h->lowcase_key, h->key.data, h->key.len);
                }

                hh = ngx_hash_find(&umcf->headers_in_hash, h->hash,
                                   h->lowcase_key, h->key.len);

                if (hh && hh->handler(r, h, hh->offset) != NGX_OK) {
                    return NGX_ERROR;
                }

                ngx_log_debug2(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                               "http fastcgi header: \"%V: %V\"",
                               &h->key, &h->value);

                if (u->buffer.pos < u->buffer.last) {
                    continue;
                }

                /* the end of the FastCGI record */

                break;
            }

            if (rc == NGX_HTTP_PARSE_HEADER_DONE) {

                /* a whole header has been parsed successfully */

                ngx_log_debug0(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                               "http fastcgi header done");

                if (u->headers_in.status) {
                    status_line = &u->headers_in.status->value;

                    status = ngx_atoi(status_line->data, 3);

                    if (status == NGX_ERROR) {
                        ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                                      "upstream sent invalid status \"%V\"",
                                      status_line);
                        return NGX_HTTP_UPSTREAM_INVALID_HEADER;
                    }

                    u->headers_in.status_n = status;
                    u->headers_in.status_line = *status_line;

                } else if (u->headers_in.location) {
                    u->headers_in.status_n = 302;
                    ngx_str_set(&u->headers_in.status_line,
                                "302 Moved Temporarily");

                } else {
                    u->headers_in.status_n = 200;
                    ngx_str_set(&u->headers_in.status_line, "200 OK");
                }

                if (u->state && u->state->status == 0) {
                    u->state->status = u->headers_in.status_n;
                }

                break;
            }

            /* there was error while a header line parsing */

            ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                          "upstream sent invalid header");

            return NGX_HTTP_UPSTREAM_INVALID_HEADER;
        }

        if (last) {
            u->buffer.last = last;
        }

        f->length -= u->buffer.pos - start;

        if (f->length == 0) {
            f->state = ngx_http_fastcgi_st_padding;
        }

        if (rc == NGX_HTTP_PARSE_HEADER_DONE) {
            return NGX_OK;
        }

        if (rc == NGX_OK) {
            continue;
        }

        /* rc == NGX_AGAIN */

        ngx_log_debug0(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                       "upstream split a header line in FastCGI records");

        if (f->split_parts == NULL) {
            f->split_parts = ngx_array_create(r->pool, 1,
                                        sizeof(ngx_http_fastcgi_split_part_t));
            if (f->split_parts == NULL) {
                return NGX_ERROR;
            }
        }

        part = ngx_array_push(f->split_parts);
        if (part == NULL) {
            return NGX_ERROR;
        }

        part->start = part_start;
        part->end = part_end;

        if (u->buffer.pos < u->buffer.last) {
            continue;
        }

        return NGX_AGAIN;
    }
}